

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O3

int __thiscall
asio::detail::reactive_socket_service<asio::ip::udp>::bind
          (reactive_socket_service<asio::ip::udp> *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  sa_family_t sVar1;
  error_code *this_00;
  int iVar2;
  int *piVar3;
  error_category *peVar4;
  undefined4 in_register_0000000c;
  socklen_t __len_00;
  int iVar5;
  undefined4 in_register_00000034;
  
  iVar5 = *(int *)CONCAT44(in_register_00000034,__fd);
  this_00 = (error_code *)CONCAT44(in_register_0000000c,__len);
  if (iVar5 == -1) {
    std::error_code::operator=(this_00,bad_descriptor);
    iVar5 = this_00->_M_value;
  }
  else {
    sVar1 = __addr->sa_family;
    piVar3 = __errno_location();
    *piVar3 = 0;
    __len_00 = 0x1c;
    if (sVar1 == 2) {
      __len_00 = 0x10;
    }
    iVar2 = ::bind(iVar5,__addr,__len_00);
    iVar5 = *piVar3;
    if (system_category()::instance == '\0') {
      bind();
    }
    this_00->_M_value = iVar5;
    this_00->_M_cat = (error_category *)&system_category()::instance;
    if (iVar2 == 0) {
      peVar4 = (error_category *)std::_V2::system_category();
      this_00->_M_value = 0;
      iVar5 = 0;
      this_00->_M_cat = peVar4;
    }
  }
  return iVar5;
}

Assistant:

asio::error_code bind(implementation_type& impl,
      const endpoint_type& endpoint, asio::error_code& ec)
  {
    socket_ops::bind(impl.socket_, endpoint.data(), endpoint.size(), ec);
    return ec;
  }